

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<ki::protocol::net::Session*,char_const*,unsigned_long>::
load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<ki::protocol::net::Session*,char_const*,unsigned_long> *this,long call)

{
  handle src;
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x30),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_6_ = CONCAT15(bVar2,(undefined5)uStack_18);
  src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  if (src.m_ptr != (PyObject *)0x0) {
    if (src.m_ptr != (PyObject *)&_Py_NoneStruct) {
      bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)(this + 8),src,SUB41(((uint)**(ulong **)(call + 0x20) & 2) >> 1,0));
      goto LAB_00149bbd;
    }
    if ((**(ulong **)(call + 0x20) & 2) != 0) {
      this[0x28] = (argument_loader<ki::protocol::net::Session*,char_const*,unsigned_long>)0x1;
      bVar2 = true;
      goto LAB_00149bbd;
    }
  }
  bVar2 = false;
LAB_00149bbd:
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  type_caster<unsigned_long,_void>::load
            ((type_caster<unsigned_long,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x10),
             SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  if ((char)((ulong)uStack_18 >> 0x28) == '\x01') {
    lVar3 = 0;
    do {
      bVar2 = lVar3 == 2;
      if (bVar2) {
        return bVar2;
      }
      lVar1 = lVar3 + 6;
      lVar3 = lVar3 + 1;
    } while (*(char *)((long)&uStack_18 + lVar1) != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }